

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  wchar_t wVar1;
  uint uVar2;
  char *format;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
LAB_001dc383:
    uVar2 = 0;
    _glfwInputError(error,format);
  }
  else {
    switch(attrib) {
    case 0x22001:
      uVar2 = *(uint *)(handle + 0x1c4);
      break;
    case 0x22002:
      uVar2 = *(uint *)(handle + 0x1c8);
      break;
    case 0x22003:
      uVar2 = *(uint *)(handle + 0x1cc);
      break;
    case 0x22004:
      uVar2 = *(uint *)(handle + 0x1d0);
      break;
    case 0x22005:
      uVar2 = *(uint *)(handle + 0x1dc);
      break;
    case 0x22006:
      uVar2 = (uint)(byte)handle[0x1d4];
      break;
    case 0x22007:
      uVar2 = (uint)(byte)handle[0x1d5];
      break;
    case 0x22008:
      uVar2 = *(uint *)(handle + 0x1d8);
      break;
    case 0x22009:
      uVar2 = *(uint *)(handle + 0x1e0);
      break;
    default:
      switch(attrib) {
      case 0x20001:
        wVar1 = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
        return wVar1;
      case 0x20002:
        wVar1 = _glfwPlatformWindowIconified((_GLFWwindow *)handle);
        return wVar1;
      case 0x20003:
        uVar2 = (uint)(byte)handle[8];
        break;
      case 0x20004:
        wVar1 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
        return wVar1;
      case 0x20005:
        uVar2 = (uint)(byte)handle[9];
        break;
      default:
        format = "Invalid window attribute";
        error = 0x10003;
        goto LAB_001dc383;
      case 0x20007:
        uVar2 = (uint)(byte)handle[0xb];
      }
    }
  }
  return uVar2;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return _glfwPlatformWindowFocused(window);
        case GLFW_ICONIFIED:
            return _glfwPlatformWindowIconified(window);
        case GLFW_VISIBLE:
            return _glfwPlatformWindowVisible(window);
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_FLOATING:
            return window->floating;
        case GLFW_CLIENT_API:
            return window->context.api;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->context.major;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->context.minor;
        case GLFW_CONTEXT_REVISION:
            return window->context.revision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->context.robustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->context.forward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->context.debug;
        case GLFW_OPENGL_PROFILE:
            return window->context.profile;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            return window->context.release;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute");
    return 0;
}